

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KnotAli.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  size_type sVar1;
  pointer pcVar2;
  long lVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  iterator __begin1;
  pointer pbVar7;
  pointer pbVar8;
  ostream *poVar9;
  iterator __end1;
  size_type sVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string file;
  string input_file;
  string output_file_k;
  string input_type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seqs2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seqs;
  string final;
  string seq_2;
  string consensus;
  double energy;
  string structure;
  args_info args_info;
  istringstream ss;
  ofstream out;
  int local_63c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  undefined1 *local_598;
  undefined8 local_590;
  undefined1 local_588;
  undefined7 uStack_587;
  string local_578;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_558;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  long *local_4a0;
  long local_498;
  long local_490 [2];
  string local_480;
  string local_460;
  double local_440;
  string local_438;
  args_info local_418;
  long *local_3b0 [2];
  long local_3a0 [13];
  ios_base local_338 [264];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  iVar6 = cmdline_parser(argc,argv,&local_418);
  if (iVar6 == 0) {
    local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
    local_5f8._M_string_length = 0;
    local_5f8.field_2._M_local_buf[0] = '\0';
    if (local_418.inputs_num == 0) {
      cVar4 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x30);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&local_5f8,cVar4);
    }
    else {
      __s = *local_418.inputs;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&local_5f8,0,(char *)0x0,(ulong)__s);
    }
    local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
    local_578._M_string_length = 0;
    local_578.field_2._M_local_buf[0] = '\0';
    if (local_418.input_type_given == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_578,0,(char *)0x0,0x12dbb3);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_578);
    }
    local_598 = &local_588;
    local_590 = 0;
    local_588 = 0;
    if (local_418.output_file_given == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_598,0,(char *)0x0,0x12dc43);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_598);
    }
    local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
    if (local_418.paramFile_given == 0) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_618,"params/rna_DirksPierce09.par","");
    }
    else {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_618,parameter_file_abi_cxx11_._M_dataplus._M_p,
                 parameter_file_abi_cxx11_._M_dataplus._M_p +
                 parameter_file_abi_cxx11_._M_string_length);
    }
    bVar5 = exists(&local_618);
    if (bVar5) {
      vrna_params_load(local_618._M_dataplus._M_p,0);
    }
    local_63c = 2;
    if (local_418.dangles_given != 0) {
      local_63c = dangle_model;
    }
    cmdline_parser_free(&local_418);
    bVar5 = exists(&local_5f8);
    if (bVar5) {
      local_538.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_538.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_538.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_558.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_558.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_558.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_638.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_638.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_638.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      updateVectors(&local_538,&local_558,&local_638,&local_5f8,&local_578);
      uVar13 = (long)local_538.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_538.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      pbVar8 = local_558.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar7 = local_538.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (uVar13 != 0) {
        do {
          sVar1 = pbVar7->_M_string_length;
          if (sVar1 != 0) {
            pcVar2 = (pbVar7->_M_dataplus)._M_p;
            sVar10 = 0;
            do {
              if (pcVar2[sVar10] == 'T') {
                pcVar2[sVar10] = 'U';
              }
              sVar10 = sVar10 + 1;
            } while (sVar1 != sVar10);
          }
          pbVar7 = pbVar7 + 1;
        } while (pbVar7 != local_538.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      for (; pbVar8 != local_558.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
        sVar1 = pbVar8->_M_string_length;
        if (sVar1 != 0) {
          pcVar2 = (pbVar8->_M_dataplus)._M_p;
          sVar10 = 0;
          do {
            if (pcVar2[sVar10] == 'T') {
              pcVar2[sVar10] = 'U';
            }
            sVar10 = sVar10 + 1;
          } while (sVar1 != sVar10);
        }
      }
      MIVector(&local_438,&local_538);
      uVar13 = uVar13 >> 5;
      uVar12 = (uint)uVar13;
      if (local_418.verbose_given != 0) {
        printf("\t The number of sequences are %d\n",uVar13 & 0xffffffff);
        printf("\t The structure found through covariation of the alignment is: \n\n%s\n",
               local_438._M_dataplus._M_p);
      }
      std::ofstream::ofstream((ostream *)&local_230,(string *)&local_598,_S_trunc);
      if (0 < (int)uVar12) {
        uVar13 = (ulong)(uVar12 & 0x7fffffff);
        lVar11 = 0;
        do {
          local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
          lVar3 = *(long *)((long)&((local_538.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar11);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5b8,lVar3,
                     *(long *)((long)&(local_538.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length
                              + lVar11) + lVar3);
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_480,local_438._M_dataplus._M_p,
                     local_438._M_dataplus._M_p + local_438._M_string_length);
          returnUngapped(&local_460,&local_5b8,&local_480);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p != &local_480.field_2) {
            operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
            operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
          }
          local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
          lVar3 = *(long *)((long)&((local_558.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar11);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4c0,lVar3,
                     *(long *)((long)&(local_558.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length
                              + lVar11) + lVar3);
          removeIUPAC(&local_4c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
            operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
          }
          local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5d8,local_4a0,local_498 + (long)local_4a0);
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_500,local_460._M_dataplus._M_p,
                     local_460._M_dataplus._M_p + local_460._M_string_length);
          Iterative_Fold(&local_4e0,&local_5d8,&local_500,&local_440,local_63c);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
            operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::substr
                    ((ulong)local_3b0,
                     (long)&((local_638.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar11
                    );
          iVar6 = std::__cxx11::string::compare((char *)local_3b0);
          if (local_3b0[0] != local_3a0) {
            operator_delete(local_3b0[0],local_3a0[0] + 1);
          }
          if (iVar6 == 0) {
            std::__cxx11::string::substr
                      ((ulong)local_3b0,
                       (long)&((local_638.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar11);
            std::__cxx11::string::operator=
                      ((string *)
                       ((long)&((local_638.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar11),(string *)local_3b0);
            if (local_3b0[0] != local_3a0) {
              operator_delete(local_3b0[0],local_3a0[0] + 1);
            }
          }
          std::__cxx11::string::substr
                    ((ulong)local_3b0,
                     (long)&((local_638.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar11
                    );
          iVar6 = std::__cxx11::string::compare((char *)local_3b0);
          if (local_3b0[0] != local_3a0) {
            operator_delete(local_3b0[0],local_3a0[0] + 1);
          }
          if (iVar6 == 0) {
            std::__cxx11::string::substr
                      ((ulong)local_3b0,
                       (long)&((local_638.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar11);
            std::__cxx11::string::operator=
                      ((string *)
                       ((long)&((local_638.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar11),(string *)local_3b0);
            if (local_3b0[0] != local_3a0) {
              operator_delete(local_3b0[0],local_3a0[0] + 1);
            }
          }
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)local_3b0,
                     (string *)
                     ((long)&((local_638.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar11),_S_in);
          std::operator>>((istream *)local_3b0,
                          (string *)
                          ((long)&((local_638.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar11));
          std::operator+(&local_520,">",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((local_638.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar11));
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_230,local_520._M_dataplus._M_p,
                              local_520._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
          }
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_230,
                              *(char **)((long)&((local_558.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                _M_dataplus)._M_p + lVar11),
                              *(long *)((long)&(local_558.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                               _M_string_length + lVar11));
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_230,local_4e0._M_dataplus._M_p,
                              local_4e0._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          poVar9 = std::ostream::_M_insert<double>(local_440);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          cVar4 = (char)(ostream *)&local_230;
          std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar4);
          std::ostream::put(cVar4);
          std::ostream::flush();
          std::__cxx11::istringstream::~istringstream((istringstream *)local_3b0);
          std::ios_base::~ios_base(local_338);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
            operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
          }
          if (local_4a0 != local_490) {
            operator_delete(local_4a0,local_490[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_460._M_dataplus._M_p != &local_460.field_2) {
            operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
          }
          lVar11 = lVar11 + 0x20;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
      std::ofstream::close();
      local_230 = _VTT;
      *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _stdin;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_638);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_558);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_538);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._M_dataplus._M_p != &local_618.field_2) {
        operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
      }
      if (local_598 != &local_588) {
        operator_delete(local_598,CONCAT71(uStack_587,local_588) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT71(local_578.field_2._M_allocated_capacity._1_7_,
                                 local_578.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
        operator_delete(local_5f8._M_dataplus._M_p,
                        CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                 local_5f8.field_2._M_local_buf[0]) + 1);
      }
      return 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Input File does not exist!",0x1a);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {


    args_info args_info;

	// get options (call gengetopt command line parser)
	if (cmdline_parser (argc, argv, &args_info) != 0) {
	exit(1);
	}

	std::string input_file;
	if (args_info.inputs_num>0) {
	input_file=args_info.inputs[0];
	} else {
	std::getline(std::cin,input_file);
	}
    bool verbose;
	verbose = args_info.verbose_given;

    // bool stacking;
    // stacking = args_info.stacking_given;

    std::string input_type;
    args_info.input_type_given ? input_type = type : input_type = "FASTA";

    std::string output_file_k;
    args_info.output_file_given ? output_file_k = output_file : output_file_k = "results.afa";

    std::string file= args_info.paramFile_given ? parameter_file : "params/rna_DirksPierce09.par";
	if(exists(file)){
		vrna_params_load(file.c_str(), VRNA_PARAMETER_FORMAT_DEFAULT);
	}

    int dangles = args_info.dangles_given ? dangle_model : 2;

    cmdline_parser_free(&args_info);

    if(!exists(input_file)){
        std::cout << "Input File does not exist!" << std::endl;
        exit (EXIT_FAILURE);
    }



    // Define the data structures for the sequences
    std::vector <std::string> seqs;
    std::vector <std::string> seqs2;
    std::vector <std::string> names;

    updateVectors(seqs,seqs2,names,input_file, input_type);

    // number of sequences
    int n_seq = seqs.size();

    // Converts any possible T's to U's in the sequences
    for(std::string &seq : seqs) seqtoRNA(seq);
    for(std::string &seq : seqs2) seqtoRNA(seq);

    // Uses covariation/ Mutual Information to find probable structurally important base pairs
    std::string structure = MIVector(seqs);

    if(verbose){
      printf ("\t The number of sequences are %d\n", n_seq);
      printf ("\t The structure found through covariation of the alignment is: \n\n%s\n", structure.c_str());  
    }
    
    // The output file
    std::ofstream out(output_file_k, std::ofstream::trunc);
    for(int i=0; i<n_seq; ++i){
    
        std::string consensus = returnUngapped(seqs[i],structure);
        std::string seq = removeIUPAC(seqs2[i]);
        double energy;        

        std::string final = Iterative_Fold(seq,consensus, energy, dangles);
    
        // makes sure name is in correct format
        if(names[i].substr(names[i].length()-4,4) == ".seq") names[i] = names[i].substr(0,names[i].length()-4);
        if(names[i].substr(names[i].length()-3,3) == ".ct") names[i] = names[i].substr(0,names[i].length()-3);
        std::istringstream ss(names[i]);
        ss >> names[i];

        /**   Outputting to file     **/
        out << ">" + names[i] << std::endl;
        out << seqs2[i] << std::endl;
        out << final << std::endl;
        out << energy << std::endl;
        out << std::endl;
    }
    out.close();
    
    return 0;
}